

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterfaceValidators.cpp
# Opt level: O2

Result * CoreML::validateMultiFunctionDescription
                   (Result *__return_storage_ptr__,ModelDescription *interface,int modelVersion,
                   ValidationPolicy *validationPolicy)

{
  int iVar1;
  Rep *pRVar2;
  FunctionDescription *interface_00;
  Result *this;
  bool bVar3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var4;
  string *psVar5;
  long lVar6;
  void **ppvVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  allocator<char> local_111;
  Result *local_110;
  int local_104;
  string *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  ModelDescription *local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (validationPolicy->allowsMultipleFunctions == false) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"This model type doesn\'t support multi-function syntax.",
               (allocator<char> *)&local_b8);
    Result::Result(__return_storage_ptr__,MODEL_TYPE_DOES_NOT_SUPPORT_MULTI_FUNCTION,&local_f8);
    psVar5 = &local_f8;
  }
  else {
    if (8 < modelVersion) {
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pRVar2 = (interface->functions_).super_RepeatedPtrFieldBase.rep_;
      ppvVar7 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar7 = (void **)0x0;
      }
      iVar1 = (interface->functions_).super_RepeatedPtrFieldBase.current_size_;
      local_100 = (string *)&__return_storage_ptr__->m_message;
      psVar5 = (string *)validationPolicy;
      local_110 = __return_storage_ptr__;
      local_104 = modelVersion;
      local_98 = interface;
      for (lVar6 = 0; (long)iVar1 * 8 != lVar6; lVar6 = lVar6 + 8) {
        interface_00 = *(FunctionDescription **)((long)ppvVar7 + lVar6);
        psVar5 = (string *)validationPolicy;
        validateFeatureDescriptions<CoreML::Specification::FunctionDescription>
                  (__return_storage_ptr__,interface_00,local_104,validationPolicy);
        bVar3 = Result::good(__return_storage_ptr__);
        if (!bVar3) goto LAB_0026bca9;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_d8,
                    (value_type *)
                    ((ulong)(interface_00->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
        std::__cxx11::string::~string(local_100);
      }
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((ulong)(local_98->defaultfunctionname_).tagged_ptr_.ptr_ & 0xfffffffffffffffe);
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                        (local_d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_d8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish,__rhs);
      this = local_110;
      if (_Var4._M_current ==
          local_d8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::operator+(&local_70,"The default function name \'",__rhs);
        std::operator+(&local_b8,&local_70,"\' is not found in the function name list: ");
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,",",&local_111);
        componentsJoinedBy<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                  (&local_50,(CoreML *)&local_d8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_90,psVar5);
        std::operator+(&local_f8,&local_b8,&local_50);
        Result::Result(this,INVALID_DEFAULT_FUNCTION_NAME,&local_f8);
        std::__cxx11::string::~string((string *)&local_f8);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_70);
      }
      else {
        Result::Result(local_110);
      }
LAB_0026bca9:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_d8);
      return local_110;
    }
    std::__cxx11::to_string(&local_50,9);
    std::operator+(&local_70,"Multi-function syntax is only valid in specification verison >= ",
                   &local_50);
    std::operator+(&local_b8,&local_70,". This model has version ");
    std::__cxx11::to_string(&local_90,modelVersion);
    std::operator+(&local_f8,&local_b8,&local_90);
    Result::Result(__return_storage_ptr__,INVALID_COMPATIBILITY_VERSION,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_70);
    psVar5 = &local_50;
  }
  std::__cxx11::string::~string((string *)psVar5);
  return __return_storage_ptr__;
}

Assistant:

Result validateMultiFunctionDescription(const Specification::ModelDescription& interface, int modelVersion, const ValidationPolicy& validationPolicy) {
        if (!validationPolicy.allowsMultipleFunctions) {
            return  Result(ResultType::MODEL_TYPE_DOES_NOT_SUPPORT_MULTI_FUNCTION,
                           "This model type doesn't support multi-function syntax.");
        }

        if (modelVersion < MLMODEL_SPECIFICATION_VERSION_IOS18) {
            return  Result(ResultType::INVALID_COMPATIBILITY_VERSION,
                           "Multi-function syntax is only valid in specification verison >= " + std::to_string(MLMODEL_SPECIFICATION_VERSION_IOS18)+
                           ". This model has version " + std::to_string(modelVersion));
        }

        const auto& functions = interface.functions();
        auto functionNames = std::vector<std::string>();
        for (const auto& function: functions) {
            Result r = validateFeatureDescriptions(function, modelVersion, validationPolicy);
            if (!r.good()) {
                return r;
            }
            functionNames.push_back(function.name());
        }

        // The default function name must be in function name list.
        const auto& defaultFunctionName = interface.defaultfunctionname();
        if (find(functionNames.begin(), functionNames.end(), defaultFunctionName) == functionNames.end()) {
            return  Result(ResultType::INVALID_DEFAULT_FUNCTION_NAME,
                           "The default function name '" + defaultFunctionName + "' is not found in the function name list: " + componentsJoinedBy(functionNames, ","));
        }

        return Result();
    }